

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateCast(ExpressionEvalContext *ctx,ExprTypeCast *expression)

{
  ExpressionContext *pEVar1;
  _func_int **pp_Var2;
  TypeBase *pTVar3;
  uint uVar4;
  int iVar5;
  ExprPointerLiteral *in_RAX;
  ExprMemoryLiteral *memory;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TypeRef *pTVar6;
  ExprMemoryLiteral *el1;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  uchar *puVar7;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  ExprPointerLiteral *this;
  undefined4 extraout_var_16;
  ExprBase *pEVar8;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  ExprMemoryLiteral *pEVar9;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  TypeBase **ppTVar10;
  SynBase *pSVar11;
  undefined **ppuVar12;
  TypeBase *pTVar13;
  char *pcVar14;
  ExprPointerLiteral *pEVar15;
  Allocator *pAVar16;
  ExprTypeLiteral *typeLiteral;
  undefined1 uVar17;
  bool bVar18;
  longlong result;
  ExprPointerLiteral *local_38;
  undefined4 extraout_var_13;
  
  if (ctx->instructionsLimit <= ctx->instruction) {
    pcVar14 = "ERROR: instruction limit reached";
LAB_0024cef7:
    Report(ctx,pcVar14);
    return (ExprBase *)0x0;
  }
  ctx->instruction = ctx->instruction + 1;
  local_38 = in_RAX;
  memory = (ExprMemoryLiteral *)Evaluate(ctx,expression->value);
  if (memory == (ExprMemoryLiteral *)0x0) {
    return (ExprBase *)0x0;
  }
  switch(expression->category) {
  case EXPR_CAST_NUMERICAL:
    bVar18 = ExpressionContext::IsIntegerType(ctx->ctx,(expression->super_ExprBase).type);
    if (!bVar18) {
      bVar18 = ExpressionContext::IsFloatingPointType(ctx->ctx,(expression->super_ExprBase).type);
      if (bVar18) {
        local_38 = (ExprPointerLiteral *)0x0;
        bVar18 = TryTakeDouble((ExprBase *)memory,(double *)&local_38);
        if (bVar18) {
          pTVar13 = (expression->super_ExprBase).type;
          pEVar1 = ctx->ctx;
          if (pTVar13 == pEVar1->typeFloat) {
            iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
            this = (ExprPointerLiteral *)CONCAT44(extraout_var_25,iVar5);
            ppTVar10 = &ctx->ctx->typeFloat;
            pEVar15 = (ExprPointerLiteral *)(double)(float)(double)local_38;
          }
          else {
            if (pTVar13 != pEVar1->typeDouble) goto switchD_0024ce54_default;
            iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
            this = (ExprPointerLiteral *)CONCAT44(extraout_var_16,iVar5);
            ppTVar10 = &ctx->ctx->typeDouble;
            pEVar15 = local_38;
          }
          pTVar13 = *ppTVar10;
          pSVar11 = (expression->super_ExprBase).source;
          (this->super_ExprBase).typeID = 7;
          (this->super_ExprBase).source = pSVar11;
          (this->super_ExprBase).type = pTVar13;
          (this->super_ExprBase).next = (ExprBase *)0x0;
          (this->super_ExprBase).listed = false;
          (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6400;
          this->ptr = (uchar *)pEVar15;
          goto LAB_0024d714;
        }
      }
      goto switchD_0024ce54_default;
    }
    local_38 = (ExprPointerLiteral *)0x0;
    if ((memory->super_ExprBase).typeID == 7) {
      pTVar13 = (expression->super_ExprBase).type;
      pEVar1 = ctx->ctx;
      if (pTVar13 == pEVar1->typeBool) {
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_20,iVar5);
        pSVar11 = (expression->super_ExprBase).source;
        pEVar15 = memory->ptr;
        pTVar13 = ctx->ctx->typeBool;
        (this->super_ExprBase).typeID = 3;
        (this->super_ExprBase).source = pSVar11;
        (this->super_ExprBase).type = pTVar13;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6358;
        (this->super_ExprBase).field_0x29 = (double)pEVar15 != 0.0;
        goto LAB_0024d714;
      }
      if (pTVar13 == pEVar1->typeChar) {
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_24,iVar5);
        pSVar11 = (expression->super_ExprBase).source;
        pTVar13 = ctx->ctx->typeChar;
        pEVar15 = memory->ptr;
        (this->super_ExprBase).typeID = 4;
        (this->super_ExprBase).source = pSVar11;
        (this->super_ExprBase).type = pTVar13;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6390;
        (this->super_ExprBase).field_0x29 = (char)(int)(double)pEVar15;
        goto LAB_0024d714;
      }
      if (pTVar13 == pEVar1->typeShort) {
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_27,iVar5);
        pSVar11 = (expression->super_ExprBase).source;
        pTVar13 = ctx->ctx->typeShort;
        pEVar15 = (ExprPointerLiteral *)(long)(short)(int)(double)memory->ptr;
      }
      else if (pTVar13 == pEVar1->typeInt) {
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_29,iVar5);
        pSVar11 = (expression->super_ExprBase).source;
        pTVar13 = ctx->ctx->typeInt;
        pEVar15 = (ExprPointerLiteral *)(long)(int)(double)memory->ptr;
      }
      else {
        if (pTVar13 != pEVar1->typeLong) goto switchD_0024ce54_default;
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var,iVar5);
        pSVar11 = (expression->super_ExprBase).source;
        pTVar13 = ctx->ctx->typeLong;
        pEVar15 = (ExprPointerLiteral *)(long)(double)memory->ptr;
      }
    }
    else {
      bVar18 = TryTakeLong((ExprBase *)memory,(longlong *)&local_38);
      if (!bVar18) goto switchD_0024ce54_default;
      pTVar13 = (expression->super_ExprBase).type;
      pEVar1 = ctx->ctx;
      if (pTVar13 == pEVar1->typeBool) {
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_26,iVar5);
        pSVar11 = (expression->super_ExprBase).source;
        pTVar13 = ctx->ctx->typeBool;
        bVar18 = local_38 == (ExprPointerLiteral *)0x0;
        goto LAB_0024d2ea;
      }
      if (pTVar13 == pEVar1->typeChar) {
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_28,iVar5);
        pSVar11 = (expression->super_ExprBase).source;
        pTVar13 = ctx->ctx->typeChar;
        (this->super_ExprBase).typeID = 4;
        (this->super_ExprBase).source = pSVar11;
        (this->super_ExprBase).type = pTVar13;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        ppuVar12 = &PTR__ExprBase_003e6390;
        uVar17 = local_38._0_1_;
        goto LAB_0024d707;
      }
      if (pTVar13 == pEVar1->typeShort) {
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_30,iVar5);
        pSVar11 = (expression->super_ExprBase).source;
        pTVar13 = ctx->ctx->typeShort;
        pEVar15 = (ExprPointerLiteral *)(long)(short)local_38;
      }
      else if (pTVar13 == pEVar1->typeInt) {
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_31,iVar5);
        pSVar11 = (expression->super_ExprBase).source;
        pTVar13 = ctx->ctx->typeInt;
        pEVar15 = (ExprPointerLiteral *)(long)(int)local_38;
      }
      else {
        if (pTVar13 != pEVar1->typeLong) goto switchD_0024ce54_default;
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_17,iVar5);
        pSVar11 = (expression->super_ExprBase).source;
        pTVar13 = ctx->ctx->typeLong;
        pEVar15 = local_38;
      }
    }
LAB_0024dc32:
    (this->super_ExprBase).typeID = 6;
    (this->super_ExprBase).source = pSVar11;
    (this->super_ExprBase).type = pTVar13;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e63c8;
    this->ptr = (uchar *)pEVar15;
    goto LAB_0024d714;
  case EXPR_CAST_PTR_TO_BOOL:
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x30);
    this = (ExprPointerLiteral *)CONCAT44(extraout_var_08,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pTVar13 = ctx->ctx->typeBool;
    bVar18 = (memory->super_ExprBase).typeID == 9;
    goto LAB_0024d2ea;
  case EXPR_CAST_UNSIZED_TO_BOOL:
    if ((memory->super_ExprBase).typeID != 0xd) {
      memory = (ExprMemoryLiteral *)0x0;
    }
    pTVar6 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    pEVar8 = CreateExtract(ctx,memory,0,&pTVar6->super_TypeBase);
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x30);
    this = (ExprPointerLiteral *)CONCAT44(extraout_var_03,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pTVar13 = ctx->ctx->typeBool;
    if (pEVar8 == (ExprBase *)0x0) {
      uVar17 = true;
    }
    else {
      uVar17 = pEVar8->typeID != 9;
    }
    (this->super_ExprBase).typeID = 3;
    (this->super_ExprBase).source = pSVar11;
    (this->super_ExprBase).type = pTVar13;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    ppuVar12 = &PTR__ExprBase_003e6358;
LAB_0024d707:
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)ppuVar12;
    (this->super_ExprBase).field_0x29 = uVar17;
    goto LAB_0024d714;
  case EXPR_CAST_FUNCTION_TO_BOOL:
    pEVar9 = (ExprMemoryLiteral *)0x0;
    if ((memory->super_ExprBase).typeID == 0xb) {
      pEVar9 = memory;
    }
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x30);
    this = (ExprPointerLiteral *)CONCAT44(extraout_var_04,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pTVar13 = ctx->ctx->typeBool;
    bVar18 = pEVar9->ptr == (ExprPointerLiteral *)0x0;
LAB_0024d2ea:
    (this->super_ExprBase).typeID = 3;
    (this->super_ExprBase).source = pSVar11;
    (this->super_ExprBase).type = pTVar13;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6358;
    (this->super_ExprBase).field_0x29 = !bVar18;
    goto LAB_0024d714;
  case EXPR_CAST_NULL_TO_PTR:
    pAVar16 = ctx->ctx->allocator;
LAB_0024cf81:
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x30);
    this = (ExprPointerLiteral *)CONCAT44(extraout_var_00,iVar5);
    (this->super_ExprBase).typeID = 9;
    pTVar13 = (expression->super_ExprBase).type;
    (this->super_ExprBase).source = (expression->super_ExprBase).source;
    (this->super_ExprBase).type = pTVar13;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e65c0;
    goto LAB_0024d714;
  case EXPR_CAST_NULL_TO_AUTO_PTR:
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x38);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_09,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pEVar1 = ctx->ctx;
    pTVar13 = pEVar1->typeVoid;
    pTVar3 = pEVar1->typeTypeID;
    (memory->super_ExprBase).typeID = 8;
    (memory->super_ExprBase).source = pSVar11;
    (memory->super_ExprBase).type = pTVar3;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6550;
    memory->ptr = (ExprPointerLiteral *)pTVar13;
    iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
    el1 = (ExprMemoryLiteral *)CONCAT44(extraout_var_10,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pTVar6 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    (el1->super_ExprBase).typeID = 9;
    (el1->super_ExprBase).source = pSVar11;
    (el1->super_ExprBase).type = &pTVar6->super_TypeBase;
    (el1->super_ExprBase).next = (ExprBase *)0x0;
    (el1->super_ExprBase).listed = false;
    (el1->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e65c0;
    pTVar13 = (expression->super_ExprBase).type;
    break;
  case EXPR_CAST_NULL_TO_UNSIZED:
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x30);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_11,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pTVar6 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    (memory->super_ExprBase).typeID = 9;
    (memory->super_ExprBase).source = pSVar11;
    (memory->super_ExprBase).type = &pTVar6->super_TypeBase;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e65c0;
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x38);
    el1 = (ExprMemoryLiteral *)CONCAT44(extraout_var_12,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pTVar13 = ctx->ctx->typeInt;
    (el1->super_ExprBase).typeID = 6;
    (el1->super_ExprBase).source = pSVar11;
    (el1->super_ExprBase).type = pTVar13;
    (el1->super_ExprBase).next = (ExprBase *)0x0;
    (el1->super_ExprBase).listed = false;
    (el1->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e63c8;
    el1->ptr = (ExprPointerLiteral *)0x0;
    pTVar13 = (expression->super_ExprBase).type;
    break;
  case EXPR_CAST_NULL_TO_AUTO_ARRAY:
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x38);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_05,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pEVar1 = ctx->ctx;
    pTVar13 = pEVar1->typeVoid;
    pTVar3 = pEVar1->typeTypeID;
    (memory->super_ExprBase).typeID = 8;
    (memory->super_ExprBase).source = pSVar11;
    (memory->super_ExprBase).type = pTVar3;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6550;
    memory->ptr = (ExprPointerLiteral *)pTVar13;
    iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x30);
    el1 = (ExprMemoryLiteral *)CONCAT44(extraout_var_06,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pTVar6 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    (el1->super_ExprBase).typeID = 9;
    (el1->super_ExprBase).source = pSVar11;
    (el1->super_ExprBase).type = &pTVar6->super_TypeBase;
    (el1->super_ExprBase).next = (ExprBase *)0x0;
    (el1->super_ExprBase).listed = false;
    (el1->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e65c0;
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x38);
    pEVar8 = (ExprBase *)CONCAT44(extraout_var_07,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pTVar13 = ctx->ctx->typeInt;
    pEVar8->typeID = 6;
    pEVar8->source = pSVar11;
    pEVar8->type = pTVar13;
    pEVar8->next = (ExprBase *)0x0;
    pEVar8->listed = false;
    pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e63c8;
    pEVar8[1]._vptr_ExprBase = (_func_int **)0x0;
    pTVar13 = (expression->super_ExprBase).type;
    goto LAB_0024d65c;
  case EXPR_CAST_NULL_TO_FUNCTION:
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x30);
    puVar7 = (uchar *)CONCAT44(extraout_var_13,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pTVar6 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    puVar7[8] = '\t';
    puVar7[9] = '\0';
    puVar7[10] = '\0';
    puVar7[0xb] = '\0';
    *(SynBase **)(puVar7 + 0x10) = pSVar11;
    *(TypeRef **)(puVar7 + 0x18) = pTVar6;
    puVar7[0x20] = '\0';
    puVar7[0x21] = '\0';
    puVar7[0x22] = '\0';
    puVar7[0x23] = '\0';
    puVar7[0x24] = '\0';
    puVar7[0x25] = '\0';
    puVar7[0x26] = '\0';
    puVar7[0x27] = '\0';
    puVar7[0x28] = '\0';
    *(undefined ***)puVar7 = &PTR__ExprBase_003e65c0;
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x40);
    this = (ExprPointerLiteral *)CONCAT44(extraout_var_14,iVar5);
    (this->super_ExprBase).typeID = 0xb;
    pTVar13 = (expression->super_ExprBase).type;
    (this->super_ExprBase).source = (expression->super_ExprBase).source;
    (this->super_ExprBase).type = pTVar13;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e8740;
    this->ptr = (uchar *)0x0;
    this->end = puVar7;
    goto LAB_0024d714;
  case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
    pTVar13 = (memory->super_ExprBase).type;
    if ((pTVar13 == (TypeBase *)0x0) || (pTVar13->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4b9,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pp_Var2 = pTVar13[1]._vptr_TypeBase;
    if ((pp_Var2 == (_func_int **)0x0) || (*(int *)(pp_Var2 + 1) != 0x13)) {
      __assert_fail("arrType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4bd,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    if (*(int *)((long)pp_Var2 + 0x6c) != 0) {
      __assert_fail("unsigned(arrType->length) == arrType->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4be,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pTVar13 = (expression->super_ExprBase).type;
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x38);
    el1 = (ExprMemoryLiteral *)CONCAT44(extraout_var_02,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeInt;
    pEVar15 = (ExprPointerLiteral *)pp_Var2[0xd];
    (el1->super_ExprBase).typeID = 6;
    (el1->super_ExprBase).source = pSVar11;
    (el1->super_ExprBase).type = pTVar3;
    (el1->super_ExprBase).next = (ExprBase *)0x0;
    (el1->super_ExprBase).listed = false;
    (el1->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e63c8;
    el1->ptr = pEVar15;
    break;
  case EXPR_CAST_PTR_TO_AUTO_PTR:
    pTVar13 = (memory->super_ExprBase).type;
    if ((pTVar13 == (TypeBase *)0x0) || (pTVar13->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4cc,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pp_Var2 = pTVar13[1]._vptr_TypeBase;
    if (((pp_Var2 == (_func_int **)0x0) || (*(int *)(pp_Var2 + 1) != 0x18)) ||
       ((*(char *)(pp_Var2 + 0x22) == '\0' && (pp_Var2[0x23] == (_func_int *)0x0)))) {
      pAVar16 = ctx->ctx->allocator;
      iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x38);
      pEVar9 = (ExprMemoryLiteral *)CONCAT44(extraout_var_15,iVar5);
      pSVar11 = (expression->super_ExprBase).source;
      pTVar3 = ctx->ctx->typeTypeID;
      pEVar15 = (ExprPointerLiteral *)pTVar13[1]._vptr_TypeBase;
      (pEVar9->super_ExprBase).typeID = 8;
      (pEVar9->super_ExprBase).source = pSVar11;
      (pEVar9->super_ExprBase).type = pTVar3;
      (pEVar9->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar9->super_ExprBase).listed = false;
      (pEVar9->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6550;
      pEVar9->ptr = pEVar15;
    }
    else {
      uVar4 = (memory->super_ExprBase).typeID;
      if (uVar4 != 0xc) {
        if (uVar4 != 9) {
          __assert_fail("ptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x4d9,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
        }
        pcVar14 = "ERROR: null pointer access";
        goto LAB_0024cef7;
      }
      if ((long)memory[1].super_ExprBase._vptr_ExprBase - (long)memory->ptr < 4) {
        __assert_fail("ptr->end - ptr->ptr >= 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x4da,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
      }
      pAVar16 = ctx->ctx->allocator;
      iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x40);
      pEVar8 = (ExprBase *)CONCAT44(extraout_var_19,iVar5);
      pSVar11 = (expression->super_ExprBase).source;
      pTVar6 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeTypeID);
      pEVar15 = memory->ptr;
      pEVar8->typeID = 0xc;
      pEVar8->source = pSVar11;
      pEVar8->type = &pTVar6->super_TypeBase;
      pEVar8->next = (ExprBase *)0x0;
      pEVar8->listed = false;
      pEVar8->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e8708;
      pEVar8[1]._vptr_ExprBase = (_func_int **)pEVar15;
      *(undefined1 **)&pEVar8[1].typeID =
           (undefined1 *)((long)&(pEVar15->super_ExprBase)._vptr_ExprBase + 4);
      pEVar9 = (ExprMemoryLiteral *)CreateLoad(ctx,pEVar8);
    }
    pTVar13 = (expression->super_ExprBase).type;
    el1 = memory;
    memory = pEVar9;
    break;
  case EXPR_CAST_AUTO_PTR_TO_PTR:
    pTVar13 = (expression->super_ExprBase).type;
    if ((pTVar13 == (TypeBase *)0x0) || (pTVar13->typeID != 0x12)) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4ef,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pEVar9 = memory;
    if ((memory->super_ExprBase).typeID != 0xd) {
      pEVar9 = (ExprMemoryLiteral *)0x0;
    }
    pEVar8 = CreateExtract(ctx,pEVar9,0,ctx->ctx->typeTypeID);
    if (pEVar8[1]._vptr_ExprBase != pTVar13[1]._vptr_TypeBase) goto switchD_0024ce54_default;
    this = (ExprPointerLiteral *)CreateExtract(ctx,pEVar9,4,pTVar13);
    goto LAB_0024d661;
  case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
    pTVar13 = (memory->super_ExprBase).type;
    if ((pTVar13 == (TypeBase *)0x0) || (pTVar13->typeID != 0x14)) {
      __assert_fail("arrType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x504,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pEVar9 = memory;
    if ((memory->super_ExprBase).typeID != 0xd) {
      pEVar9 = (ExprMemoryLiteral *)0x0;
    }
    pAVar16 = ctx->ctx->allocator;
    iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x38);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_01,iVar5);
    pSVar11 = (expression->super_ExprBase).source;
    pEVar1 = ctx->ctx;
    pTVar3 = pEVar1->typeTypeID;
    pEVar15 = *(ExprPointerLiteral **)&pTVar13[1].typeIndex;
    (memory->super_ExprBase).typeID = 8;
    (memory->super_ExprBase).source = pSVar11;
    (memory->super_ExprBase).type = pTVar3;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6550;
    memory->ptr = pEVar15;
    pTVar6 = ExpressionContext::GetReferenceType(pEVar1,pEVar1->typeVoid);
    el1 = (ExprMemoryLiteral *)CreateExtract(ctx,pEVar9,0,&pTVar6->super_TypeBase);
    pEVar8 = CreateExtract(ctx,pEVar9,8,ctx->ctx->typeInt);
    pTVar13 = (expression->super_ExprBase).type;
    goto LAB_0024d65c;
  case EXPR_CAST_REINTERPRET:
    pTVar13 = (expression->super_ExprBase).type;
    pEVar1 = ctx->ctx;
    if ((pTVar13 == pEVar1->typeInt) && ((memory->super_ExprBase).type == pEVar1->typeTypeID)) {
      pTVar13 = (TypeBase *)memory->ptr;
      if ((pTVar13 != (TypeBase *)0x0) &&
         ((pTVar13->typeID < 0x1d && ((0x18000001U >> (pTVar13->typeID & 0x1f) & 1) != 0)))) {
        return (ExprBase *)0x0;
      }
      uVar4 = ExpressionContext::GetTypeIndex(pEVar1,pTVar13);
      pAVar16 = ctx->ctx->allocator;
      iVar5 = (*pAVar16->_vptr_Allocator[2])(pAVar16,0x38);
      this = (ExprPointerLiteral *)CONCAT44(extraout_var_18,iVar5);
      pSVar11 = (expression->super_ExprBase).source;
      pTVar13 = ctx->ctx->typeInt;
      pEVar15 = (ExprPointerLiteral *)(ulong)uVar4;
      goto LAB_0024dc32;
    }
    if (pTVar13 == (TypeBase *)0x0) goto switchD_0024ce54_default;
    switch(pTVar13->typeID) {
    case 0x12:
      pTVar3 = (memory->super_ExprBase).type;
      if ((pTVar3 == (TypeBase *)0x0) || (pTVar3->typeID != 0x12)) goto switchD_0024ce54_default;
      uVar4 = (memory->super_ExprBase).typeID;
      if (uVar4 == 0xc) {
        if ((_func_int *)((long)memory[1].super_ExprBase._vptr_ExprBase - (long)memory->ptr) <
            pTVar13[1]._vptr_TypeBase[6]) {
          __assert_fail("uintptr_t(tmp->end - tmp->ptr) >= uintptr_t(refType->subType->size)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0x52d,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
        }
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x40);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_32,iVar5);
        ExprPointerLiteral::ExprPointerLiteral
                  (this,(expression->super_ExprBase).source,(expression->super_ExprBase).type,
                   (uchar *)memory->ptr,(uchar *)memory[1].super_ExprBase._vptr_ExprBase);
        goto LAB_0024d714;
      }
      if (uVar4 != 9) goto switchD_0024ce54_default;
      pAVar16 = pEVar1->allocator;
      goto LAB_0024cf81;
    case 0x14:
      pTVar13 = (memory->super_ExprBase).type;
      if ((pTVar13 == (TypeBase *)0x0) || (pTVar13->typeID != 0x14)) goto switchD_0024ce54_default;
      pEVar9 = (ExprMemoryLiteral *)0x0;
      if ((memory->super_ExprBase).typeID == 0xd) {
        pEVar9 = memory;
      }
      iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
      this = (ExprPointerLiteral *)CONCAT44(extraout_var_23,iVar5);
      pEVar15 = pEVar9->ptr;
      (this->super_ExprBase).typeID = 0xd;
      pTVar13 = (expression->super_ExprBase).type;
      (this->super_ExprBase).source = (expression->super_ExprBase).source;
      (this->super_ExprBase).type = pTVar13;
      (this->super_ExprBase).next = (ExprBase *)0x0;
      (this->super_ExprBase).listed = false;
      ppuVar12 = &PTR__ExprBase_003e8778;
      goto LAB_0024da2d;
    case 0x15:
      pTVar13 = (memory->super_ExprBase).type;
      if ((pTVar13 != (TypeBase *)0x0) && (pTVar13->typeID == 0x15)) {
        pEVar9 = (ExprMemoryLiteral *)0x0;
        if ((memory->super_ExprBase).typeID == 0xb) {
          pEVar9 = memory;
        }
        iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x40);
        this = (ExprPointerLiteral *)CONCAT44(extraout_var_21,iVar5);
        (this->super_ExprBase).typeID = 0xb;
        pSVar11 = (expression->super_ExprBase).source;
        pTVar13 = (expression->super_ExprBase).type;
        (this->super_ExprBase).next = (ExprBase *)0x0;
        (this->super_ExprBase).listed = false;
        (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e8740;
        pEVar15 = pEVar9->ptr;
        pp_Var2 = pEVar9[1].super_ExprBase._vptr_ExprBase;
        (this->super_ExprBase).source = pSVar11;
        (this->super_ExprBase).type = pTVar13;
        this->ptr = (uchar *)pEVar15;
        this->end = (uchar *)pp_Var2;
        goto LAB_0024d714;
      }
    case 0x13:
    case 0x16:
    case 0x17:
    case 0x18:
switchD_0024ce54_default:
      pTVar13 = (memory->super_ExprBase).type;
      pcVar14 = (pTVar13->name).begin;
      pTVar3 = (expression->super_ExprBase).type;
      Report(ctx,"ERROR: failed to cast \'%.*s\' to \'%.*s\'",
             (ulong)(uint)(*(int *)&(pTVar13->name).end - (int)pcVar14),pcVar14,
             (ulong)(uint)(*(int *)&(pTVar3->name).end - (int)(pTVar3->name).begin));
      return (ExprBase *)0x0;
    case 0x19:
      pTVar13 = (memory->super_ExprBase).type;
      if ((pTVar13 == (TypeBase *)0x0) || (pTVar13->typeID != 5)) goto switchD_0024ce54_default;
      break;
    default:
      if (((pTVar13->typeID != 5) ||
          (pTVar13 = (memory->super_ExprBase).type, pTVar13 == (TypeBase *)0x0)) ||
         (pTVar13->typeID != 0x19)) goto switchD_0024ce54_default;
    }
    pEVar9 = (ExprMemoryLiteral *)0x0;
    if ((memory->super_ExprBase).typeID == 6) {
      pEVar9 = memory;
    }
    iVar5 = (*pEVar1->allocator->_vptr_Allocator[2])(pEVar1->allocator,0x38);
    this = (ExprPointerLiteral *)CONCAT44(extraout_var_22,iVar5);
    pEVar15 = pEVar9->ptr;
    (this->super_ExprBase).typeID = 6;
    pTVar13 = (expression->super_ExprBase).type;
    (this->super_ExprBase).source = (expression->super_ExprBase).source;
    (this->super_ExprBase).type = pTVar13;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    ppuVar12 = &PTR__ExprBase_003e63c8;
LAB_0024da2d:
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)ppuVar12;
    this->ptr = (uchar *)pEVar15;
    goto LAB_0024d714;
  default:
    goto switchD_0024ce54_default;
  }
  pEVar8 = (ExprBase *)0x0;
LAB_0024d65c:
  this = (ExprPointerLiteral *)
         CreateConstruct(ctx,pTVar13,&memory->super_ExprBase,&el1->super_ExprBase,pEVar8);
LAB_0024d661:
  if (this == (ExprPointerLiteral *)0x0) {
    return (ExprBase *)0x0;
  }
LAB_0024d714:
  pEVar8 = CheckType(&expression->super_ExprBase,&this->super_ExprBase);
  return pEVar8;
}

Assistant:

ExprBase* EvaluateCast(ExpressionEvalContext &ctx, ExprTypeCast *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	switch(expression->category)
	{
	case EXPR_CAST_NUMERICAL:
		if(ctx.ctx.IsIntegerType(expression->type))
		{
			long long result = 0;

			if(ExprRationalLiteral *expr = getType<ExprRationalLiteral>(value))
			{
				if(expression->type == ctx.ctx.typeBool)
					return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, expr->value != 0.0));

				if(expression->type == ctx.ctx.typeChar)
					return CheckType(expression, new (ctx.ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(expression->source, ctx.ctx.typeChar, (char)expr->value));

				if(expression->type == ctx.ctx.typeShort)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeShort, (short)expr->value));

				if(expression->type == ctx.ctx.typeInt)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, (int)expr->value));

				if(expression->type == ctx.ctx.typeLong)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeLong, (long long)expr->value));
			}
			else if(TryTakeLong(value, result))
			{
				if(expression->type == ctx.ctx.typeBool)
					return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, result != 0));

				if(expression->type == ctx.ctx.typeChar)
					return CheckType(expression, new (ctx.ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(expression->source, ctx.ctx.typeChar, (char)result));

				if(expression->type == ctx.ctx.typeShort)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeShort, (short)result));

				if(expression->type == ctx.ctx.typeInt)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, (int)result));

				if(expression->type == ctx.ctx.typeLong)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeLong, result));
			}
		}
		else if(ctx.ctx.IsFloatingPointType(expression->type))
		{
			double result = 0.0;

			if(TryTakeDouble(value, result))
			{
				if(expression->type == ctx.ctx.typeFloat)
					return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, ctx.ctx.typeFloat, (float)result));

				if(expression->type == ctx.ctx.typeDouble)
					return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, ctx.ctx.typeDouble, result));
			}
		}
		break;
	case EXPR_CAST_PTR_TO_BOOL:
		return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !isType<ExprNullptrLiteral>(value)));
	case EXPR_CAST_UNSIZED_TO_BOOL:
		{
			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprBase *ptr = CreateExtract(ctx, memLiteral, 0, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !isType<ExprNullptrLiteral>(ptr)));
		}
		break;
	case EXPR_CAST_FUNCTION_TO_BOOL:
		{
			ExprFunctionLiteral *funcLiteral = getType<ExprFunctionLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, funcLiteral->data != NULL));
		}
		break;
	case EXPR_CAST_NULL_TO_PTR:
		return CheckType(expression, new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->type));
	case EXPR_CAST_NULL_TO_AUTO_PTR:
		{
			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, ctx.ctx.typeVoid);
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_UNSIZED:
		{
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *size = new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, 0);

			ExprBase *result = CreateConstruct(ctx, expression->type, ptr, size, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_AUTO_ARRAY:
		{
			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, ctx.ctx.typeVoid);
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *length = new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, 0);

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, length);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_FUNCTION:
		{
			ExprBase *context = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			ExprFunctionLiteral *result = new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, expression->type, NULL, context);

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
		{
			TypeRef *refType = getType<TypeRef>(value->type);

			assert(refType);

			TypeArray *arrType = getType<TypeArray>(refType->subType);

			assert(arrType);
			assert(unsigned(arrType->length) == arrType->length);

			ExprBase *result = CreateConstruct(ctx, expression->type, value, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, arrType->length), NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_PTR_TO_AUTO_PTR:
		{
			TypeRef *refType = getType<TypeRef>(value->type);

			assert(refType);

			TypeClass *classType = getType<TypeClass>(refType->subType);

			ExprBase *typeId = NULL;

			if(classType && (classType->extendable || classType->baseClass))
			{
				if(isType<ExprNullptrLiteral>(value))
					return Report(ctx, "ERROR: null pointer access");

				ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

				assert(ptr);
				assert(ptr->end - ptr->ptr >= 4);

				typeId = CreateLoad(ctx, new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeTypeID), ptr->ptr, ptr->ptr + 4));
			}
			else
			{
				typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, refType->subType);
			}

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, value, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_AUTO_PTR_TO_PTR:
		{
			TypeRef *refType = getType<TypeRef>(expression->type);

			assert(refType);

			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprTypeLiteral *typeId = getType<ExprTypeLiteral>(CreateExtract(ctx, memLiteral, 0, ctx.ctx.typeTypeID));

			if(typeId->value != refType->subType)
				return Report(ctx, "ERROR: failed to cast '%.*s' to '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(expression->type->name));

			ExprBase *ptr = CreateExtract(ctx, memLiteral, 4, refType);

			if(!ptr)
				return NULL;

			return CheckType(expression, ptr);
		}
		break;
	case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
		{
			TypeUnsizedArray *arrType = getType<TypeUnsizedArray>(value->type);

			assert(arrType);

			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, arrType->subType);
			ExprBase *ptr = CreateExtract(ctx, memLiteral, 0, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *length = CreateExtract(ctx, memLiteral, sizeof(void*), ctx.ctx.typeInt);

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, length);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_REINTERPRET:
		if(expression->type == ctx.ctx.typeInt && value->type == ctx.ctx.typeTypeID)
		{
			ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value);

			if(isType<TypeError>(typeLiteral->value))
				return NULL;

			if(isType<TypeArgumentSet>(typeLiteral->value) || isType<TypeMemberSet>(typeLiteral->value))
				return NULL;

			unsigned index = ctx.ctx.GetTypeIndex(typeLiteral->value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, index));
		}
		else if(isType<TypeRef>(expression->type) && isType<TypeRef>(value->type))
		{
			TypeRef *refType = getType<TypeRef>(expression->type);

			if(isType<ExprNullptrLiteral>(value))
				return CheckType(expression, new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->type));
			
			if(ExprPointerLiteral *tmp = getType<ExprPointerLiteral>(value))
			{
				(void)refType;
				assert(uintptr_t(tmp->end - tmp->ptr) >= uintptr_t(refType->subType->size));

				return CheckType(expression, new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, expression->type, tmp->ptr, tmp->end));
			}
		}
		else if(isType<TypeUnsizedArray>(expression->type) && isType<TypeUnsizedArray>(value->type))
		{
			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprMemoryLiteral>()) ExprMemoryLiteral(expression->source, expression->type, memLiteral->ptr));
		}
		else if(isType<TypeFunction>(expression->type) && isType<TypeFunction>(value->type))
		{
			ExprFunctionLiteral *funcLiteral = getType<ExprFunctionLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, expression->type, funcLiteral->data, funcLiteral->context));
		}
		else if(isType<TypeInt>(expression->type) && isType<TypeEnum>(value->type))
		{
			ExprIntegerLiteral *intLiteral = getType<ExprIntegerLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, intLiteral->value));
		}
		else if(isType<TypeEnum>(expression->type) && isType<TypeInt>(value->type))
		{
			ExprIntegerLiteral *intLiteral = getType<ExprIntegerLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, intLiteral->value));
		}
		break;
	}

	return Report(ctx, "ERROR: failed to cast '%.*s' to '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(expression->type->name));
}